

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>const,baryonyx::bit_array>
          (compute_order *this,
          solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
          *solver,bit_array *x)

{
  int iVar1;
  pointer ppVar2;
  pair<int,_int> pVar3;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Var4;
  int iVar5;
  uint uVar6;
  int iVar7;
  pair<int,_int> pVar8;
  pair<int,_int> local_68;
  pair<int,_int> local_60;
  _Head_base<0UL,_int_*,_false> local_58;
  sparse_matrix<int> *local_50;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_40;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_38;
  
  ppVar2 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  local_58._M_head_impl = (int *)&this->m_order;
  local_50 = &solver->ap;
  local_38._M_head_impl = (col_value *)0x0;
  local_40._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._4_4_ = 0;
  local_40._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._0_4_ =
       solver->m;
  local_48._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )this;
  do {
    if ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
         )local_38._M_head_impl ==
        (_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
         )local_40._M_t.
          super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl) {
      return (int)((ulong)((long)*(pointer *)
                                  ((long)local_48._M_t.
                                         super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                         .
                                         super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                         ._M_head_impl + 0x20) -
                          (long)(((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)((long)local_48._M_t.
                                            super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                            .
                                            super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                            ._M_head_impl + 0x18))->
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    sparse_matrix<int>::row((sparse_matrix<int> *)&local_68,(int)local_50);
    pVar3 = local_68;
    iVar7 = 0;
    for (pVar8 = local_60; _Var4._M_head_impl = local_38._M_head_impl, pVar8 != pVar3;
        pVar8 = (pair<int,_int>)((long)pVar8 + 8)) {
      iVar1 = (solver->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl[*(int *)pVar8];
      iVar5 = bit_array::operator[](x,*(int *)((long)pVar8 + 4));
      iVar7 = iVar7 + iVar5 * iVar1;
    }
    iVar1 = (solver->b)._M_t.
            super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor_*,_false>
            ._M_head_impl[(long)local_38._M_head_impl].value;
    uVar6 = iVar1 - iVar7;
    if (uVar6 == 0 || iVar1 < iVar7) {
      if (iVar1 < iVar7) {
        uVar6 = iVar7 - iVar1;
        goto LAB_00263a7c;
      }
    }
    else {
LAB_00263a7c:
      local_68 = (pair<int,_int>)((ulong)uVar6 << 0x20 | (ulong)local_38._M_head_impl);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 local_58._M_head_impl,&local_68);
    }
    local_38._M_head_impl = (col_value *)((long)&(_Var4._M_head_impl)->value + 1);
  } while( true );
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }